

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O3

CppTypeName * __thiscall
capnp::anon_unknown_1::CppTypeName::makeTemplateParam
          (CppTypeName *__return_storage_ptr__,CppTypeName *this,StringPtr name)

{
  undefined1 local_58 [24];
  ArrayDisposer *local_40;
  Branch *local_38;
  ArrayDisposer *local_30;
  Branch *pBStack_28;
  size_t local_20;
  CppTypeName *local_18;
  
  local_58._8_8_ = name.content.ptr + -1;
  local_58._0_8_ = this;
  kj::StringTree::concat<kj::ArrayPtr<char_const>>
            ((StringTree *)(local_58 + 0x10),(StringTree *)local_58,
             (ArrayPtr<const_char> *)local_58._8_8_);
  (__return_storage_ptr__->name).size_ = local_58._16_8_;
  (__return_storage_ptr__->name).text.content.ptr = (char *)local_40;
  (__return_storage_ptr__->name).text.content.size_ = (size_t)local_38;
  (__return_storage_ptr__->name).text.content.disposer = local_30;
  (__return_storage_ptr__->name).branches.ptr = pBStack_28;
  (__return_storage_ptr__->name).branches.size_ = local_20;
  (__return_storage_ptr__->name).branches.disposer = (ArrayDisposer *)local_18;
  __return_storage_ptr__->isArgDependent = true;
  __return_storage_ptr__->needsTypename = false;
  __return_storage_ptr__->hasInterfaces_ = false;
  __return_storage_ptr__->hasDisambiguatedTemplate_ = false;
  return local_18;
}

Assistant:

static CppTypeName makeTemplateParam(kj::StringPtr name) {
    return CppTypeName(kj::strTree(name), true);
  }